

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetaobject.cpp
# Opt level: O0

int __thiscall QMetaObject::indexOfProperty(QMetaObject *this,char *name)

{
  uint index;
  int iVar1;
  QMetaObjectPrivate *pQVar2;
  char *__s2;
  void **ppvVar3;
  char *in_RSI;
  QMetaObject *in_RDI;
  long in_FS_OFFSET;
  QAbstractDynamicMetaObject *me;
  char *prop;
  int i;
  QMetaObjectPrivate *d;
  QMetaObject *m;
  Data data;
  QMetaObject *in_stack_ffffffffffffffa0;
  int local_3c;
  QMetaObject *local_30;
  int local_14;
  Data local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30 = in_RDI;
  do {
    if (local_30 == (QMetaObject *)0x0) {
      pQVar2 = priv((in_RDI->d).data);
      if ((pQVar2->flags & 1U) == 0) {
        local_14 = -1;
      }
      else {
        ppvVar3 = &in_RDI[-1].d.extradata;
        local_14 = (**(code **)((long)*ppvVar3 + 0x28))(ppvVar3,in_RSI,0);
      }
LAB_0035fa6b:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return local_14;
      }
      __stack_chk_fail();
    }
    pQVar2 = priv((local_30->d).data);
    for (local_3c = 0; local_3c < pQVar2->propertyCount; local_3c = local_3c + 1) {
      local_10.d = (uint *)&DAT_aaaaaaaaaaaaaaaa;
      local_10 = QMetaProperty::getMetaPropertyData
                           (in_RDI,(int)((ulong)in_stack_ffffffffffffffa0 >> 0x20));
      in_stack_ffffffffffffffa0 = local_30;
      index = QMetaProperty::Data::name(&local_10);
      __s2 = rawStringData(in_stack_ffffffffffffffa0,index);
      iVar1 = strcmp(in_RSI,__s2);
      if (iVar1 == 0) {
        local_14 = propertyOffset(in_stack_ffffffffffffffa0);
        local_14 = local_14 + local_3c;
        goto LAB_0035fa6b;
      }
    }
    local_30 = SuperData::operator_cast_to_QMetaObject_((SuperData *)local_30);
  } while( true );
}

Assistant:

int QMetaObject::indexOfProperty(const char *name) const
{
    const QMetaObject *m = this;
    while (m) {
        const QMetaObjectPrivate *d = priv(m->d.data);
        for (int i = 0; i < d->propertyCount; ++i) {
            const QMetaProperty::Data data = QMetaProperty::getMetaPropertyData(m, i);
            const char *prop = rawStringData(m, data.name());
            if (strcmp(name, prop) == 0) {
                i += m->propertyOffset();
                return i;
            }
        }
        m = m->d.superdata;
    }

    if (priv(this->d.data)->flags & DynamicMetaObject) {
        QAbstractDynamicMetaObject *me =
            const_cast<QAbstractDynamicMetaObject *>(static_cast<const QAbstractDynamicMetaObject *>(this));

        return me->createProperty(name, nullptr);
    }

    return -1;
}